

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

bool DoLoadGLNodes(FileReader **lumps)

{
  int *piVar1;
  double *pdVar2;
  long *plVar3;
  undefined8 uVar4;
  ushort uVar5;
  FileReader *pFVar6;
  side_t *psVar7;
  seg_t *psVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  subsector_t *psVar14;
  int iVar15;
  vertex_t *__src;
  vertex_t *pvVar16;
  bool bVar17;
  uint uVar18;
  int *piVar19;
  long lVar20;
  ushort *puVar21;
  size_t __n;
  subsector_t *__s;
  ulong uVar22;
  long lVar23;
  uint j;
  ulong uVar24;
  ushort *puVar25;
  long lVar26;
  line_t_conflict *plVar27;
  sector_t_conflict *psVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  long lVar32;
  size_t sVar33;
  
  pFVar6 = *lumps;
  firstglvertex = numvertexes;
  lVar23 = pFVar6->Length;
  uVar31 = (ulong)(int)lVar23;
  piVar19 = (int *)operator_new__(uVar31);
  uVar22 = 0;
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar6,0,0);
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar6,piVar19,uVar31);
  __src = vertexes;
  iVar30 = *piVar19;
  if ((iVar30 != 0x32644e67) && (iVar30 != 0x35644e67)) {
    Printf("GL nodes v%d found. This format is not supported by ZDoom\n",
           (ulong)((uint)(iVar30 == 0x34644e67) * 3 + 1));
    operator_delete__(piVar19);
    return false;
  }
  format5 = iVar30 == 0x35644e67;
  numvertexes = (int)((ulong)((lVar23 << 0x20) + -0x400000000 >> 0x20) >> 3) + numvertexes;
  lVar23 = (long)numvertexes;
  uVar31 = lVar23 << 4;
  if (numvertexes < 0) {
    uVar31 = 0xffffffffffffffff;
  }
  vertexes = (vertex_t *)operator_new__(uVar31);
  lVar32 = (long)firstglvertex;
  sVar33 = lVar32 * 0x10;
  memcpy(vertexes,__src,sVar33);
  uVar31 = (ulong)(uint)numlines;
  if (numlines < 1) {
    uVar31 = uVar22;
  }
  for (; pvVar16 = vertexes, uVar31 * 0x98 - uVar22 != 0; uVar22 = uVar22 + 0x98) {
    *(long *)((long)lines->args + (uVar22 - 0x2c)) =
         (*(long *)((long)lines->args + (uVar22 - 0x2c)) - (long)__src) + (long)vertexes;
    *(long *)((long)lines->args + (uVar22 - 0x24)) =
         (*(long *)((long)lines->args + (uVar22 - 0x24)) - (long)__src) + (long)vertexes;
  }
  lVar20 = 4;
  for (; lVar32 < lVar23; lVar32 = lVar32 + 1) {
    uVar4 = *(undefined8 *)((long)piVar19 + lVar20);
    pdVar2 = (double *)((long)pvVar16 + lVar20 * 2 + (sVar33 - 8));
    *pdVar2 = (double)(int)uVar4 * 1.52587890625e-05;
    pdVar2[1] = (double)(int)((ulong)uVar4 >> 0x20) * 1.52587890625e-05;
    lVar20 = lVar20 + 8;
  }
  operator_delete__(piVar19);
  pFVar6 = lumps[1];
  numsegs = (int)pFVar6->Length;
  puVar21 = (ushort *)operator_new__((long)numsegs);
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar6,0,0);
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar6,puVar21,(long)numsegs);
  segs = (seg_t *)0x0;
  if (format5 == '\x01') {
    lVar23 = 0;
LAB_00405185:
    iVar30 = numsegs >> 4;
    uVar31 = (ulong)iVar30;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar31;
    uVar22 = SUB168(auVar11 * ZEXT816(0x30),0);
    if (SUB168(auVar11 * ZEXT816(0x30),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    numsegs = iVar30;
    segs = (seg_t *)operator_new__(uVar22);
    lVar32 = 0;
    memset(segs,0,uVar31 * 0x30);
    uVar22 = uVar31 << 4;
    if (iVar30 < 0) {
      uVar22 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar22);
    iVar15 = firstglvertex;
    lVar20 = 0;
    for (lVar26 = 0; lVar26 < iVar30; lVar26 = lVar26 + 1) {
      uVar18 = *(uint *)((long)puVar21 + lVar32 + lVar23);
      uVar29 = (uVar18 & 0x3fffffff) + iVar15;
      if (uVar18 < 0x40000000) {
        uVar29 = uVar18;
      }
      *(vertex_t **)((long)&segs->v1 + lVar20) = vertexes + (int)uVar29;
      uVar18 = *(uint *)((long)puVar21 + lVar32 + lVar23 + 4);
      uVar29 = (uVar18 & 0x3fffffff) + iVar15;
      if (uVar18 < 0x40000000) {
        uVar29 = uVar18;
      }
      *(vertex_t **)((long)&segs->v2 + lVar20) = vertexes + (int)uVar29;
      *(undefined4 *)((long)&glsegextras->PartnerSeg + lVar32) =
           *(undefined4 *)((long)puVar21 + lVar32 + lVar23 + 0xc);
      uVar22 = (ulong)*(ushort *)((long)puVar21 + lVar32 + lVar23 + 8);
      if (uVar22 == 0xffff) {
        *(undefined8 *)((long)&segs->linedef + lVar20) = 0;
        *(undefined8 *)((long)&segs->sidedef + lVar20) = 0;
        *(undefined8 *)((long)&segs->frontsector + lVar20) = 0;
        psVar28 = (sector_t_conflict *)0x0;
      }
      else {
        plVar27 = lines + uVar22;
        *(line_t_conflict **)((long)&segs->linedef + lVar20) = plVar27;
        uVar5 = *(ushort *)((long)puVar21 + lVar32 + lVar23 + 10);
        psVar7 = plVar27->sidedef[uVar5];
        *(side_t **)((long)&segs->sidedef + lVar20) = psVar7;
        if (psVar7 == (side_t *)0x0) {
          psVar28 = (sector_t_conflict *)0x0;
        }
        else {
          psVar28 = psVar7->sector;
        }
        *(sector_t_conflict **)((long)&segs->frontsector + lVar20) = psVar28;
        if (((plVar27->flags & 4) == 0) || (plVar27->sidedef[uVar5 ^ 1] == (side_t *)0x0)) {
          plVar27->flags = plVar27->flags & 0xfffffffb;
          psVar28 = (sector_t_conflict *)0x0;
        }
        else {
          psVar28 = plVar27->sidedef[uVar5 ^ 1]->sector;
        }
      }
      *(sector_t_conflict **)((long)&segs->backsector + lVar20) = psVar28;
      lVar20 = lVar20 + 0x30;
      lVar32 = lVar32 + 0x10;
      iVar30 = numsegs;
    }
  }
  else {
    if (*(int *)puVar21 == 0x33644e67) {
      numsegs = numsegs + -4;
      lVar23 = 4;
      goto LAB_00405185;
    }
    lVar23 = 0;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (long)numsegs;
    uVar22 = SUB168(auVar9 / ZEXT816(10),0);
    iVar30 = SUB164(auVar9 / ZEXT816(10),0);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)iVar30;
    __n = SUB168(auVar10 * ZEXT816(0x30),0);
    sVar33 = __n;
    if (SUB168(auVar10 * ZEXT816(0x30),8) != 0) {
      sVar33 = 0xffffffffffffffff;
    }
    numsegs = iVar30;
    segs = (seg_t *)operator_new__(sVar33);
    memset(segs,0,__n);
    uVar31 = (long)iVar30 << 4;
    if (iVar30 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    glsegextras = (glsegextra_t *)operator_new__(uVar31);
    iVar30 = firstglvertex;
    lVar32 = 0;
    puVar25 = puVar21;
    for (lVar20 = 0; lVar20 < (int)uVar22; lVar20 = lVar20 + 1) {
      uVar5 = *puVar25;
      uVar18 = (uVar5 & 0x7fff) + iVar30;
      if (-1 < (short)uVar5) {
        uVar18 = (uint)uVar5;
      }
      *(vertex_t **)((long)&segs->v1 + lVar32) = vertexes + (int)uVar18;
      uVar5 = puVar25[1];
      uVar18 = (uVar5 & 0x7fff) + iVar30;
      if (-1 < (short)uVar5) {
        uVar18 = (uint)uVar5;
      }
      *(vertex_t **)((long)&segs->v2 + lVar32) = vertexes + (int)uVar18;
      uVar18 = (uint)puVar25[4];
      if (puVar25[4] == 0xffff) {
        uVar18 = 0xffffffff;
      }
      *(uint *)((long)&glsegextras->PartnerSeg + lVar23) = uVar18;
      if ((ulong)puVar25[2] == 0xffff) {
        *(undefined8 *)((long)&segs->linedef + lVar32) = 0;
        *(undefined8 *)((long)&segs->sidedef + lVar32) = 0;
        *(undefined8 *)((long)&segs->frontsector + lVar32) = 0;
        psVar28 = (sector_t_conflict *)0x0;
      }
      else {
        plVar27 = lines + puVar25[2];
        *(line_t_conflict **)((long)&segs->linedef + lVar32) = plVar27;
        uVar5 = puVar25[3];
        psVar7 = plVar27->sidedef[uVar5];
        *(side_t **)((long)&segs->sidedef + lVar32) = psVar7;
        if (psVar7 == (side_t *)0x0) {
          psVar28 = (sector_t_conflict *)0x0;
        }
        else {
          psVar28 = psVar7->sector;
        }
        *(sector_t_conflict **)((long)&segs->frontsector + lVar32) = psVar28;
        if (((plVar27->flags & 4) == 0) || (plVar27->sidedef[uVar5 ^ 1] == (side_t *)0x0)) {
          plVar27->flags = plVar27->flags & 0xfffffffb;
          psVar28 = (sector_t_conflict *)0x0;
        }
        else {
          psVar28 = plVar27->sidedef[uVar5 ^ 1]->sector;
        }
      }
      *(sector_t_conflict **)((long)&segs->backsector + lVar32) = psVar28;
      puVar25 = puVar25 + 5;
      uVar22 = (ulong)(uint)numsegs;
      lVar32 = lVar32 + 0x30;
      lVar23 = lVar23 + 0x10;
    }
  }
  operator_delete__(puVar21);
  pFVar6 = lumps[2];
  numsubsectors = (int)pFVar6->Length;
  piVar19 = (int *)operator_new__((long)numsubsectors);
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar6,0,0);
  (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar6,piVar19,(long)numsubsectors);
  if (numsubsectors != 0) {
    if (format5 == '\0') {
      if (*piVar19 != 0x33644e67) {
        numsubsectors = numsubsectors >> 2;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = (long)numsubsectors;
        sVar33 = SUB168(auVar12 * ZEXT816(0x30),0);
        lVar23 = 0x28;
        uVar22 = 0xffffffffffffffff;
        if (SUB168(auVar12 * ZEXT816(0x30),8) == 0) {
          uVar22 = sVar33;
        }
        __s = (subsector_t *)operator_new__(uVar22);
        lVar32 = 0;
        subsectors = __s;
        memset(__s,0,sVar33);
        do {
          if (numsubsectors <= lVar32) goto LAB_004054a4;
          *(uint *)((long)&__s->sector + lVar23) = (uint)*(ushort *)(piVar19 + lVar32);
          *(seg_t **)((long)__s + lVar23 + -0x10) =
               segs + *(ushort *)((long)piVar19 + lVar32 * 4 + 2);
          lVar32 = lVar32 + 1;
          piVar1 = (int *)((long)&subsectors->sector + lVar23);
          lVar23 = lVar23 + 0x30;
          __s = subsectors;
        } while (*piVar1 != 0);
        goto LAB_0040550a;
      }
      lVar23 = 4;
    }
    else {
      lVar23 = 0;
    }
    numsubsectors = numsubsectors >> 3;
    uVar31 = (ulong)numsubsectors;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar31;
    uVar22 = 0xffffffffffffffff;
    if (SUB168(auVar13 * ZEXT816(0x30),8) == 0) {
      uVar22 = SUB168(auVar13 * ZEXT816(0x30),0);
    }
    __s = (subsector_t *)operator_new__(uVar22);
    lVar20 = 0;
    subsectors = __s;
    memset(__s,0,uVar31 * 0x30);
    lVar32 = 0x28;
    do {
      if (numsubsectors <= lVar20) goto LAB_004054a4;
      *(undefined4 *)((long)&__s->sector + lVar32) =
           *(undefined4 *)((long)piVar19 + lVar20 * 8 + lVar23);
      *(seg_t **)((long)__s + lVar32 + -0x10) =
           segs + *(int *)((long)piVar19 + lVar20 * 8 + lVar23 + 4);
      lVar20 = lVar20 + 1;
      piVar1 = (int *)((long)&subsectors->sector + lVar32);
      lVar32 = lVar32 + 0x30;
      __s = subsectors;
    } while (*piVar1 != 0);
  }
LAB_0040550a:
  operator_delete__(piVar19);
  if (subsectors != (subsector_t *)0x0) {
    operator_delete__(subsectors);
  }
LAB_0040552a:
  subsectors = (subsector_t *)0x0;
  if (segs != (seg_t *)0x0) {
    operator_delete__(segs);
  }
  segs = (seg_t *)0x0;
  return false;
LAB_004054a4:
  uVar31 = 0;
  uVar22 = (ulong)(uint)numsubsectors;
  if (numsubsectors < 1) {
    uVar22 = uVar31;
  }
  do {
    if (uVar31 == uVar22) {
      operator_delete__(piVar19);
      bVar17 = LoadNodes(lumps[3]);
      if (bVar17) {
        uVar22 = (ulong)(uint)numsubsectors;
        if (numsubsectors < 1) {
          uVar22 = 0;
        }
        uVar31 = 0;
        do {
          if (uVar22 * 0x30 + 0x30 == uVar31 + 0x30) {
            uVar18 = CheckForMissingSegs();
            if (0 < (int)uVar18) {
              Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n",
                     (ulong)uVar18);
            }
            return uVar18 == 0;
          }
          plVar3 = (long *)((long)&subsectors->firstline + uVar31);
          uVar31 = uVar31 + 0x30;
        } while (*(long *)(*plVar3 + 0x10) != 0);
        Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
      }
      if (nodes != (node_t *)0x0) {
        operator_delete__(nodes);
      }
      nodes = (node_t *)0x0;
      if (subsectors != (subsector_t *)0x0) {
        operator_delete__(subsectors);
      }
      goto LAB_0040552a;
    }
    uVar24 = 0;
    lVar23 = 0x28;
    while( true ) {
      psVar14 = __s + uVar31;
      psVar8 = __s[uVar31].firstline;
      if (psVar14->numlines <= uVar24) break;
      if (*(long *)((long)psVar8 + lVar23 + -0x10) == 0) {
        psVar28 = psVar8->frontsector;
        *(sector_t_conflict **)((long)&psVar8->v1 + lVar23) = psVar28;
        *(sector_t_conflict **)((long)psVar8 + lVar23 + -8) = psVar28;
        __s = subsectors;
      }
      uVar24 = uVar24 + 1;
      lVar23 = lVar23 + 0x30;
    }
    uVar31 = uVar31 + 1;
  } while (psVar8[(ulong)psVar14->numlines - 1].v2 == psVar8->v1);
  goto LAB_0040550a;
}

Assistant:

static bool DoLoadGLNodes(FileReader ** lumps)
{
	if (!LoadGLVertexes(lumps[0]))
	{
		return false;
	}
	if (!LoadGLSegs(lumps[1]))
	{
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadGLSubsectors(lumps[2]))
	{
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}
	if (!LoadNodes(lumps[3]))
	{
		delete [] nodes;
		nodes = NULL;
		delete [] subsectors;
		subsectors = NULL;
		delete [] segs;
		segs = NULL;
		return false;
	}

	// Quick check for the validity of the nodes
	// For invalid nodes there is a high chance that this test will fail

	for (int i = 0; i < numsubsectors; i++)
	{
		seg_t * seg = subsectors[i].firstline;
		if (!seg->sidedef) 
		{
			Printf("GL nodes contain invalid data. The BSP has to be rebuilt.\n");
			delete [] nodes;
			nodes = NULL;
			delete [] subsectors;
			subsectors = NULL;
			delete [] segs;
			segs = NULL;
			return false;
		}
	}

	// check whether the BSP covers all sidedefs completely.
	int missing = CheckForMissingSegs();
	if (missing > 0)
	{
		Printf("%d missing segs counted in GL nodes.\nThe BSP has to be rebuilt.\n", missing);
	}
	return missing == 0;
}